

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execNbcd<(moira::Instr)82,(moira::Mode)6,(moira::Size)1>(Moira *this,u16 opcode)

{
  u32 addr;
  u32 op1;
  u32 uVar1;
  
  addr = computeEA<(moira::Mode)6,(moira::Size)1,0ul>(this,opcode & 7);
  op1 = readM<(moira::MemSpace)1,(moira::Size)1,0ul>(this,addr);
  uVar1 = (this->reg).pc;
  (this->reg).pc0 = uVar1;
  (this->queue).ird = (this->queue).irc;
  uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar1 + 2);
  (this->queue).irc = (u16)uVar1;
  uVar1 = bcd<(moira::Instr)100,(moira::Size)1>(this,op1,0);
  writeM<(moira::MemSpace)1,(moira::Size)1,4ul>(this,addr,uVar1);
  return;
}

Assistant:

void
Moira::execNbcd(u16 opcode)
{
    int reg = _____________xxx(opcode);

    switch (M) {

        case 0: // Dn
        {
            prefetch<POLLIPL>();

            sync(2);
            writeD<Byte>(reg, bcd<SBCD, Byte>(readD<Byte>(reg), 0));
            break;
        }
        default: // Ea
        {
            u32 ea, data;
            if (!readOp<M, Byte>(reg, ea, data)) return;
            prefetch();
            writeM<M, Byte, POLLIPL>(ea, bcd <SBCD,Byte> (data, 0));
            break;
        }
    }
}